

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O0

string * __thiscall
BtorSimVCDWriter::get_am_identifier(BtorSimVCDWriter *this,int64_t id,string *idx)

{
  bool bVar1;
  mapped_type *pmVar2;
  BtorSimVCDWriter *in_RCX;
  byte *in_RSI;
  string *in_RDI;
  pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> key;
  BtorSimBitVector *bv_idx;
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  key_type *__k;
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffed0;
  long in_stack_fffffffffffffed8;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  _Self local_90;
  _Self local_88 [3];
  key_type local_70;
  BtorSimBitVector *local_28;
  
  std::__cxx11::string::c_str();
  local_28 = btorsim_bv_char_to_bv((char *)in_stack_fffffffffffffe90);
  __k = &local_70;
  btorsim_bv_to_hex_string_abi_cxx11_((BtorSimBitVector *)__k);
  std::make_pair<long&,std::__cxx11::string>
            ((long *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string((string *)&local_70);
  btorsim_bv_free((BtorSimBitVector *)0x123d63);
  local_88[0]._M_node =
       (_Base_ptr)
       std::
       map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffe88,(key_type *)0x123d7e);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe88);
  bVar1 = std::operator==(local_88,&local_90);
  if (bVar1) {
    if ((*in_RSI & 1) == 0) {
      generate_next_identifier_abi_cxx11_(in_RCX);
      pmVar2 = std::
               map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_fffffffffffffed0,__k);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&stack0xfffffffffffffed0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    }
    else {
      std::__cxx11::to_string(in_stack_fffffffffffffed8);
      std::operator+((char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      std::operator+(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
      std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      pmVar2 = std::
               map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_fffffffffffffed0,__k);
      std::__cxx11::string::operator=((string *)pmVar2,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
    }
  }
  pmVar2 = std::
           map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffed0,__k);
  std::__cxx11::string::string(in_RDI,(string *)pmVar2);
  std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x124020);
  return in_RDI;
}

Assistant:

std::string
BtorSimVCDWriter::get_am_identifier (int64_t id, std::string idx)
{
  BtorSimBitVector* bv_idx = btorsim_bv_char_to_bv (idx.c_str ());
  auto key = std::make_pair (id, btorsim_bv_to_hex_string (bv_idx));
  btorsim_bv_free (bv_idx);
  if (am_identifiers.find (key) == am_identifiers.end ())
  {
    if (readable_vcd)
    {
      am_identifiers[key] = "n" + std::to_string (id) + "@" + key.second;
    }
    else
      am_identifiers[key] = generate_next_identifier ();
  }
  return am_identifiers[key];
}